

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O1

void printPredicateOperand(MCInst *MI,uint OpNo,SStream *O,char *Modifier)

{
  arm64_cc aVar1;
  int iVar2;
  MCOperand *op;
  ulong uVar3;
  undefined4 in_register_00000034;
  char *s;
  arm64_cc aVar4;
  
  op = MCInst_getOperand(MI,0);
  uVar3 = MCOperand_getImm(op);
  aVar4 = (arm64_cc)uVar3;
  aVar1 = aVar4;
  if ((int)aVar4 < 0x46) {
    switch(aVar4) {
    case ARM64_CC_PL:
    case ARM64_CC_VS:
      aVar1 = ARM64_CC_LO;
      break;
    case ARM64_CC_VC:
    case ARM64_CC_HI:
    case ARM64_CC_LS:
    case ARM64_CC_GE:
    case ARM64_CC_LT:
    case ARM64_CC_GT:
      break;
    case ARM64_CC_LE:
    case ARM64_CC_AL:
      aVar1 = ARM64_CC_LT;
      break;
    default:
      switch(aVar4) {
      case 0x26:
      case 0x27:
        aVar1 = 0x24;
        break;
      case 0x2e:
      case 0x2f:
        aVar1 = 0x2c;
      }
    }
  }
  else {
    switch(aVar4) {
    case 0x46:
    case 0x47:
      aVar1 = 0x44;
      break;
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
      break;
    case 0x4e:
    case 0x4f:
      aVar1 = 0x4c;
      break;
    default:
      switch(aVar4) {
      case 0x66:
      case 0x67:
        aVar1 = 100;
        break;
      case 0x6e:
      case 0x6f:
        aVar1 = 0x6c;
      }
    }
  }
  (MI->flat_insn->detail->field_6).arm64.cc = aVar1;
  iVar2 = strcmp(O->buffer,"cc");
  if (iVar2 == 0) {
    if ((int)aVar4 < 0x4c) {
      if (aVar4 < 0x30) {
        if ((0xd0UL >> (uVar3 & 0x3f) & 1) != 0) {
          s = "ge";
          goto LAB_001a2abb;
        }
        if ((0xd000000000U >> (uVar3 & 0x3f) & 1) != 0) {
          s = "le";
          goto LAB_001a2abb;
        }
        if ((0xd00000000000U >> (uVar3 & 0x3f) & 1) != 0) {
          s = "gt";
          goto LAB_001a2abb;
        }
      }
      if ((aVar4 - 0x46 < 2) || (aVar4 == 0x44)) {
        s = "ne";
        goto LAB_001a2abb;
      }
    }
    else {
      uVar3 = (ulong)(aVar4 - 0x4c);
      if (aVar4 - 0x4c < 0x24) {
        if ((0xdUL >> (uVar3 & 0x3f) & 1) != 0) {
          s = "eq";
          goto LAB_001a2abb;
        }
        if ((0xd000000UL >> (uVar3 & 0x3f) & 1) != 0) {
          s = "nu";
          goto LAB_001a2abb;
        }
        if ((0xd00000000U >> (uVar3 & 0x3f) & 1) != 0) {
          s = "un";
          goto LAB_001a2abb;
        }
      }
      if (aVar4 - 0x400 < 2) {
LAB_001a2ab4:
        s = "invalid-predicate";
        goto LAB_001a2abb;
      }
    }
    s = "lt";
    goto LAB_001a2abb;
  }
  iVar2 = strcmp(O->buffer,"pm");
  if (iVar2 != 0) {
    printOperand(MI,1,(SStream *)CONCAT44(in_register_00000034,OpNo));
    return;
  }
  if ((int)aVar4 < 0x46) {
    switch(aVar4) {
    case ARM64_CC_PL:
    case ARM64_CC_LE:
      goto switchD_001a29ac_caseD_66;
    case ARM64_CC_VS:
    case ARM64_CC_AL:
      goto switchD_001a29ac_caseD_67;
    case ARM64_CC_VC:
    case ARM64_CC_HI:
    case ARM64_CC_LS:
    case ARM64_CC_GE:
    case ARM64_CC_LT:
    case ARM64_CC_GT:
      goto switchD_001a29ac_caseD_68;
    default:
      switch(aVar4) {
      case 0x26:
      case 0x2e:
        goto switchD_001a29ac_caseD_66;
      case 0x27:
      case 0x2f:
        goto switchD_001a29ac_caseD_67;
      default:
        goto switchD_001a29ac_caseD_68;
      }
    }
  }
  switch(aVar4) {
  case 0x46:
  case 0x4e:
switchD_001a29ac_caseD_66:
    s = "-";
    break;
  case 0x47:
  case 0x4f:
switchD_001a29ac_caseD_67:
    s = "+";
    break;
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
switchD_001a29ac_caseD_68:
    return;
  default:
    switch(aVar4) {
    case 0x66:
    case 0x6e:
      goto switchD_001a29ac_caseD_66;
    case 0x67:
    case 0x6f:
      goto switchD_001a29ac_caseD_67;
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
      goto switchD_001a29ac_caseD_68;
    default:
      if (1 < aVar4 - 0x400) {
        return;
      }
      goto LAB_001a2ab4;
    }
  }
LAB_001a2abb:
  SStream_concat0((SStream *)CONCAT44(in_register_00000034,OpNo),s);
  return;
}

Assistant:

static void printPredicateOperand(MCInst *MI, unsigned OpNo,
		SStream *O, const char *Modifier)
{
	unsigned Code = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNo));

	MI->flat_insn->detail->ppc.bc = (ppc_bc)cc_normalize(Code);

	if (!strcmp(Modifier, "cc")) {
		switch ((ppc_predicate)Code) {
			default:	// unreachable
			case PPC_PRED_LT_MINUS:
			case PPC_PRED_LT_PLUS:
			case PPC_PRED_LT:
				SStream_concat0(O, "lt");
				return;
			case PPC_PRED_LE_MINUS:
			case PPC_PRED_LE_PLUS:
			case PPC_PRED_LE:
				SStream_concat0(O, "le");
				return;
			case PPC_PRED_EQ_MINUS:
			case PPC_PRED_EQ_PLUS:
			case PPC_PRED_EQ:
				SStream_concat0(O, "eq");
				return;
			case PPC_PRED_GE_MINUS:
			case PPC_PRED_GE_PLUS:
			case PPC_PRED_GE:
				SStream_concat0(O, "ge");
				return;
			case PPC_PRED_GT_MINUS:
			case PPC_PRED_GT_PLUS:
			case PPC_PRED_GT:
				SStream_concat0(O, "gt");
				return;
			case PPC_PRED_NE_MINUS:
			case PPC_PRED_NE_PLUS:
			case PPC_PRED_NE:
				SStream_concat0(O, "ne");
				return;
			case PPC_PRED_UN_MINUS:
			case PPC_PRED_UN_PLUS:
			case PPC_PRED_UN:
				SStream_concat0(O, "un");
				return;
			case PPC_PRED_NU_MINUS:
			case PPC_PRED_NU_PLUS:
			case PPC_PRED_NU:
				SStream_concat0(O, "nu");
				return;
			case PPC_PRED_BIT_SET:
			case PPC_PRED_BIT_UNSET:
				// llvm_unreachable("Invalid use of bit predicate code");
				SStream_concat0(O, "invalid-predicate");
				return;
		}
	}

	if (!strcmp(Modifier, "pm")) {
		switch ((ppc_predicate)Code) {
			case PPC_PRED_LT:
			case PPC_PRED_LE:
			case PPC_PRED_EQ:
			case PPC_PRED_GE:
			case PPC_PRED_GT:
			case PPC_PRED_NE:
			case PPC_PRED_UN:
			case PPC_PRED_NU:
				return;
			case PPC_PRED_LT_MINUS:
			case PPC_PRED_LE_MINUS:
			case PPC_PRED_EQ_MINUS:
			case PPC_PRED_GE_MINUS:
			case PPC_PRED_GT_MINUS:
			case PPC_PRED_NE_MINUS:
			case PPC_PRED_UN_MINUS:
			case PPC_PRED_NU_MINUS:
				SStream_concat0(O, "-");
				return;
			case PPC_PRED_LT_PLUS:
			case PPC_PRED_LE_PLUS:
			case PPC_PRED_EQ_PLUS:
			case PPC_PRED_GE_PLUS:
			case PPC_PRED_GT_PLUS:
			case PPC_PRED_NE_PLUS:
			case PPC_PRED_UN_PLUS:
			case PPC_PRED_NU_PLUS:
				SStream_concat0(O, "+");
				return;
			case PPC_PRED_BIT_SET:
			case PPC_PRED_BIT_UNSET:
				// llvm_unreachable("Invalid use of bit predicate code");
				SStream_concat0(O, "invalid-predicate");
				return;
			default:	// unreachable
				return;
		}
		// llvm_unreachable("Invalid predicate code");
	}

	//assert(StringRef(Modifier) == "reg" &&
	//		"Need to specify 'cc', 'pm' or 'reg' as predicate op modifier!");
	printOperand(MI, OpNo + 1, O);
}